

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
PDA::Transducer::Generator::Generator(Generator *this,Tokenizer *tokenizer,StoreFst *storeFst)

{
  bool bVar1;
  wostream *pwVar2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar3;
  wstring *__sysno;
  wchar_t in_R8D;
  allocator<wchar_t> local_251;
  wstring local_250;
  wstring local_230;
  wofstream ostream;
  
  this->m_mainFunctionExists = -1;
  this->m_tokenizer = tokenizer;
  this->m_storeFst = storeFst;
  std::wofstream::wofstream((wostream *)&ostream,"result.s",_S_out);
  pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::firstLineComment_abi_cxx11_);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::sectionDataString_abi_cxx11_);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,
                           (wstring *)Constants::integerOutputStringLabel_abi_cxx11_);
  pwVar2 = std::operator<<(pwVar2,L':');
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::integerOutputString_abi_cxx11_
                          );
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,
                           (wstring *)Constants::integerInputStringLabel_abi_cxx11_);
  pwVar2 = std::operator<<(pwVar2,L':');
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::integerInputString_abi_cxx11_)
  ;
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,
                           (wstring *)Constants::sectionUninitializedDataString_abi_cxx11_);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::sectionTextString_abi_cxx11_);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  bVar1 = isMainFunctionExists(this);
  if (bVar1) {
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::globlStartLabel_abi_cxx11_);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)Constants::startLabel_abi_cxx11_);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    pvVar3 = Tokenizer::identifiers(this->m_tokenizer);
    hash(&local_230,
         &(pvVar3->
          super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
          )._M_impl.super__Vector_impl_data._M_start[this->m_mainFunctionExists].decoratedName);
    call(&local_250,&local_230);
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)&local_250);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
    std::__cxx11::wstring::~wstring((wstring *)&local_230);
    local_230._M_dataplus._M_p._0_1_ = 1;
    local_230._M_dataplus._M_p._4_4_ = 0;
    local_230._M_string_length._0_2_ = 0x50;
    local_230._M_string_length._2_1_ = 0;
    local_230._M_string_length._4_4_ = 0;
    mov_abi_cxx11_(&local_250,(Generator *)0x3c,(int)&local_230,(Register *)0x0,in_R8D);
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)&local_250);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
    local_230._M_dataplus._M_p._0_1_ = 1;
    local_230._M_dataplus._M_p._4_4_ = 0;
    local_230._M_string_length._0_2_ = 0;
    local_230._M_string_length._2_1_ = 0;
    local_230._M_string_length._4_4_ = 0;
    mov_abi_cxx11_(&local_250,(Generator *)0x0,(int)&local_230,(Register *)0x0,in_R8D);
    __sysno = &local_250;
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)__sysno);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
    syscall_abi_cxx11_((Generator *)&local_250,(long)__sysno);
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)&local_250);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
  }
  else {
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_230,L"Main function not found, then all functions are extern",
               &local_251);
    comment(&local_250,&local_230);
    pwVar2 = std::operator<<((wostream *)&ostream,(wstring *)&local_250);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
    std::__cxx11::wstring::~wstring((wstring *)&local_230);
    writeGlobalFunctions(this,(wostream *)&ostream);
  }
  writeFunctions(this,(wostream *)&ostream);
  std::wofstream::~wofstream(&ostream);
  return;
}

Assistant:

Generator::Generator(const Tokenizer &tokenizer, const StoreFst &storeFst) :
    m_mainFunctionExists(-1), m_tokenizer(tokenizer),
    m_storeFst(storeFst)
{
    std::wofstream ostream("result.s");
    ostream << Constants::firstLineComment << std::endl;
    ostream << Constants::sectionDataString << std::endl;
    ostream << Constants::integerOutputStringLabel << L':' << std::endl;
    ostream << Constants::integerOutputString << std::endl;
    ostream << Constants::integerInputStringLabel << L':' << std::endl;
    ostream << Constants::integerInputString << std::endl;
    //writeLiterals(ostream);
    ostream << Constants::sectionUninitializedDataString << std::endl;
    ostream << Constants::sectionTextString << std::endl;
    if (isMainFunctionExists())
    {
        ostream << Constants::globlStartLabel << std::endl;
        ostream << Constants::startLabel << std::endl;
        ostream << call(  hash(m_tokenizer.identifiers()[static_cast<size_t>(m_mainFunctionExists)].decoratedName) ) << std::endl;
        ostream << mov(60, Register(Register::ReturnType, Register::Size::Full)) << std::endl;
        ostream << mov(0, Register(0, Register::Size::Full)) << std::endl;
        ostream << syscall() << std::endl;
    }
    else
    {
        ostream << comment(L"Main function not found, then all functions are extern") << std::endl;
        writeGlobalFunctions(ostream);
    }
    writeFunctions(ostream);
}